

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O0

void __thiscall
deqp::RandomUniformBlockCase::generateBlock
          (RandomUniformBlockCase *this,Random *rnd,deUint32 layoutFlags)

{
  Random *this_00;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  UniformBlock *pUVar4;
  iterator first;
  iterator last;
  float fVar5;
  int local_134;
  int local_10c;
  int ndx;
  value_type_conflict4 local_f8 [4];
  undefined1 local_e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  int local_80;
  int numUniforms;
  int numInstances;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  UniformBlock *local_28;
  UniformBlock *block;
  float instanceArrayWeight;
  deUint32 layoutFlags_local;
  Random *rnd_local;
  RandomUniformBlockCase *this_local;
  
  block._0_4_ = 0x3e99999a;
  block._4_4_ = layoutFlags;
  _instanceArrayWeight = rnd;
  rnd_local = (Random *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Block",&local_69);
  std::operator+(&local_48,&local_68,(char)this->m_blockNdx + 'A');
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pUVar4 = ub::ShaderInterface::allocBlock(&(this->super_UniformBlockCase).m_interface,pcVar3);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_28 = pUVar4;
  if ((this->m_maxInstances < 1) ||
     (fVar5 = de::Random::getFloat(_instanceArrayWeight), 0.3 <= fVar5)) {
    local_134 = 0;
  }
  else {
    local_134 = de::Random::getInt(_instanceArrayWeight,0,this->m_maxInstances);
  }
  local_80 = local_134;
  local_84 = de::Random::getInt(_instanceArrayWeight,1,this->m_maxBlockMembers);
  if (0 < local_80) {
    ub::UniformBlock::setArraySize(local_28,local_80);
  }
  if ((0 < local_80) || (bVar1 = de::Random::getBool(_instanceArrayWeight), bVar1)) {
    pUVar4 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"block",
               (allocator<char> *)
               ((long)&layoutFlagCandidates.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::operator+(&local_a8,&local_c8,(char)this->m_blockNdx + 'A');
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ub::UniformBlock::setInstanceName(pUVar4,pcVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&layoutFlagCandidates.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  local_f8[3] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 3);
  if ((this->m_features & 0x800) != 0) {
    local_f8[2] = 8;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 2);
  }
  if (((this->m_features & 0x1000) != 0) && ((block._4_4_ & 0x300) != 0x300)) {
    local_f8[1] = 0x10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8 + 1);
  }
  if ((this->m_features & 0x2000) != 0) {
    local_f8[0] = 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8,local_f8);
  }
  this_00 = _instanceArrayWeight;
  first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  uVar2 = de::Random::
          choose<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (this_00,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )first._M_current,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )last._M_current);
  block._4_4_ = uVar2 | block._4_4_;
  if ((this->m_features & 0x4000) != 0) {
    uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (_instanceArrayWeight,generateBlock::matrixCandidates,
                       generateType::precisionCandidates);
    block._4_4_ = uVar2 | block._4_4_;
  }
  ub::UniformBlock::setFlags(local_28,block._4_4_);
  for (local_10c = 0; local_10c < local_84; local_10c = local_10c + 1) {
    generateUniform(this,_instanceArrayWeight,local_28);
  }
  this->m_blockNdx = this->m_blockNdx + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
  return;
}

Assistant:

void RandomUniformBlockCase::generateBlock(de::Random& rnd, deUint32 layoutFlags)
{
	DE_ASSERT(m_blockNdx <= 'z' - 'a');

	const float   instanceArrayWeight = 0.3f;
	UniformBlock& block				  = m_interface.allocBlock((string("Block") + (char)('A' + m_blockNdx)).c_str());
	int numInstances = (m_maxInstances > 0 && rnd.getFloat() < instanceArrayWeight) ? rnd.getInt(0, m_maxInstances) : 0;
	int numUniforms  = rnd.getInt(1, m_maxBlockMembers);

	if (numInstances > 0)
		block.setArraySize(numInstances);

	if (numInstances > 0 || rnd.getBool())
		block.setInstanceName((string("block") + (char)('A' + m_blockNdx)).c_str());

	// Layout flag candidates.
	vector<deUint32> layoutFlagCandidates;
	layoutFlagCandidates.push_back(0);
	if (m_features & FEATURE_PACKED_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_SHARED);
	if ((m_features & FEATURE_SHARED_LAYOUT) && ((layoutFlags & DECLARE_BOTH) != DECLARE_BOTH))
		layoutFlagCandidates.push_back(LAYOUT_PACKED); // \note packed layout can only be used in a single shader stage.
	if (m_features & FEATURE_STD140_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_STD140);

	layoutFlags |= rnd.choose<deUint32>(layoutFlagCandidates.begin(), layoutFlagCandidates.end());

	if (m_features & FEATURE_MATRIX_LAYOUT)
	{
		static const deUint32 matrixCandidates[] = { 0, LAYOUT_ROW_MAJOR, LAYOUT_COLUMN_MAJOR };
		layoutFlags |=
			rnd.choose<deUint32>(&matrixCandidates[0], &matrixCandidates[DE_LENGTH_OF_ARRAY(matrixCandidates)]);
	}

	block.setFlags(layoutFlags);

	for (int ndx = 0; ndx < numUniforms; ndx++)
		generateUniform(rnd, block);

	m_blockNdx += 1;
}